

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# periodictable.cpp
# Opt level: O0

void __thiscall indigox::PeriodicTable::GeneratePeriodicTable(PeriodicTable *this)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  element_type *this_00;
  long in_RDI;
  uint uVar4;
  pair<std::_Rb_tree_iterator<std::pair<const_unsigned_char,_std::shared_ptr<indigox::Element>_>_>,_bool>
  pVar5;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>,_bool>
  pVar6;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_stack_00000118;
  FileReader *in_stack_00000120;
  Element_p elem;
  String *line;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  int count;
  Float e;
  Float V;
  Float c;
  Float r;
  Float m;
  uint8_t h;
  uint8_t o;
  uint8_t v;
  uint8_t z;
  uint8_t p;
  uint8_t g;
  String s;
  String n;
  FileReader fr;
  String file;
  String path;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  lines;
  uint in_stack_fffffffffffffcf8;
  undefined4 in_stack_fffffffffffffcfc;
  uint in_stack_fffffffffffffd00;
  undefined4 in_stack_fffffffffffffd04;
  undefined4 in_stack_fffffffffffffd0c;
  map<unsigned_char,_std::shared_ptr<indigox::Element>,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_std::shared_ptr<indigox::Element>_>_>_>
  *in_stack_fffffffffffffd10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd20;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd28;
  float in_stack_fffffffffffffd30;
  float in_stack_fffffffffffffd34;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>
  in_stack_fffffffffffffd38;
  long in_stack_fffffffffffffd40;
  undefined7 in_stack_fffffffffffffd48;
  undefined1 in_stack_fffffffffffffd4f;
  _Rb_tree_iterator<std::pair<const_unsigned_char,_std::shared_ptr<indigox::Element>_>_>
  in_stack_fffffffffffffd50;
  long in_stack_fffffffffffffd58;
  uint8_t Z;
  undefined6 in_stack_fffffffffffffd60;
  uint8_t in_stack_fffffffffffffd66;
  undefined1 uVar7;
  uint8_t in_stack_fffffffffffffd70;
  float in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd80;
  int in_stack_fffffffffffffd88;
  int in_stack_fffffffffffffd8c;
  string local_230 [32];
  _Base_ptr local_210;
  undefined1 local_208;
  string local_200 [32];
  _Base_ptr local_1e0;
  undefined1 local_1d8;
  uint8_t local_1ca;
  undefined1 local_1c9;
  string local_1c8 [32];
  string local_1a8 [48];
  string local_178 [32];
  string local_158 [32];
  reference local_138;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_130;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_128;
  undefined1 *local_120;
  int local_118;
  float local_114;
  float local_110;
  float local_10c;
  float local_108;
  float local_104;
  byte local_ff;
  byte local_fe;
  byte local_fd;
  undefined1 local_fc;
  undefined1 local_fb;
  undefined1 local_fa;
  allocator local_f9;
  string local_f8 [39];
  allocator local_d1;
  string local_d0 [32];
  string local_b0 [64];
  string local_70 [32];
  string local_50 [48];
  undefined1 local_20 [32];
  
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)0x123e0c);
  pcVar3 = (char *)std::__cxx11::string::back();
  if (*pcVar3 != '/') {
    std::__cxx11::string::append(Options::DATA_DIRECTORY_abi_cxx11_);
  }
  std::__cxx11::string::string(local_50,(string *)Options::DATA_DIRECTORY_abi_cxx11_);
  std::__cxx11::string::string(local_70,(string *)Options::PERIODIC_TABLE_FILE_abi_cxx11_);
  std::operator+(in_stack_fffffffffffffd28,in_stack_fffffffffffffd20);
  utils::FileReader::FileReader
            ((FileReader *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
             (String *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  std::__cxx11::string::~string(local_b0);
  utils::FileReader::GetAllItems(in_stack_00000120,in_stack_00000118);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_d0,"",&local_d1);
  std::allocator<char>::~allocator((allocator<char> *)&local_d1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_f8,"",&local_f9);
  std::allocator<char>::~allocator((allocator<char> *)&local_f9);
  local_fa = 0;
  local_fb = 0;
  local_fc = 0;
  local_fd = 0;
  local_fe = 0;
  local_ff = 0;
  local_104 = 0.0;
  local_108 = 0.0;
  local_10c = 0.0;
  local_110 = 0.0;
  local_114 = 0.0;
  local_118 = 0;
  local_120 = local_20;
  local_128._M_current =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
       std::
       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  local_130 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8)), bVar1
        ) {
    local_138 = __gnu_cxx::
                __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&local_128);
    switch(local_118) {
    case 0:
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),0);
      local_fc = (undefined1)iVar2;
      break;
    case 1:
      utils::toUpperFirst((String *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      std::__cxx11::string::operator=(local_d0,local_158);
      std::__cxx11::string::~string(local_158);
      break;
    case 2:
      utils::toUpperFirst((String *)CONCAT44(in_stack_fffffffffffffd8c,in_stack_fffffffffffffd88));
      std::__cxx11::string::operator=(local_f8,local_178);
      std::__cxx11::string::~string(local_178);
      break;
    case 3:
      local_104 = std::__cxx11::stof((string *)
                                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      break;
    case 4:
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),0);
      local_fa = (undefined1)iVar2;
      break;
    case 5:
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),0);
      local_fb = (undefined1)iVar2;
      break;
    case 6:
      in_stack_fffffffffffffd8c =
           std::__cxx11::stoi((string *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),0);
      local_fd = (byte)in_stack_fffffffffffffd8c;
      break;
    case 7:
      in_stack_fffffffffffffd88 =
           std::__cxx11::stoi((string *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),0);
      local_fe = (byte)in_stack_fffffffffffffd88;
      break;
    case 8:
      iVar2 = std::__cxx11::stoi((string *)
                                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                 (size_t *)
                                 CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8),0);
      local_ff = (byte)iVar2;
      break;
    case 9:
      in_stack_fffffffffffffd80 =
           std::__cxx11::stof((string *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_108 = in_stack_fffffffffffffd80;
      break;
    case 10:
      local_10c = std::__cxx11::stof((string *)
                                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      break;
    case 0xb:
      in_stack_fffffffffffffd78 =
           std::__cxx11::stof((string *)
                              CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                              (size_t *)
                              CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      local_110 = in_stack_fffffffffffffd78;
      break;
    case 0xc:
      local_114 = std::__cxx11::stof((string *)
                                     CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                                     (size_t *)
                                     CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
    }
    Z = (uint8_t)((ulong)in_stack_fffffffffffffd58 >> 0x38);
    if (local_118 == 0xc) {
      operator_new(0x60);
      local_1c9 = 1;
      uVar7 = local_fc;
      std::__cxx11::string::string(local_1a8,local_d0);
      std::__cxx11::string::string(local_1c8,local_f8);
      uVar4 = (uint)local_ff;
      in_stack_fffffffffffffd00 = (uint)local_fe;
      in_stack_fffffffffffffcf8 = (uint)local_fd;
      Element::Element((Element *)
                       CONCAT17(uVar7,CONCAT16(in_stack_fffffffffffffd66,in_stack_fffffffffffffd60))
                       ,Z,(string *)in_stack_fffffffffffffd50._M_node,
                       (string *)CONCAT17(in_stack_fffffffffffffd4f,in_stack_fffffffffffffd48),
                       (float)((ulong)in_stack_fffffffffffffd40 >> 0x20),
                       (uint8_t)((ulong)in_stack_fffffffffffffd40 >> 0x18),
                       (uint8_t)((ulong)in_stack_fffffffffffffd40 >> 0x10),in_stack_fffffffffffffd70
                       ,SUB41(in_stack_fffffffffffffd78,0),SUB41(in_stack_fffffffffffffd80,0),
                       (float)((ulong)in_stack_fffffffffffffd38._M_node >> 0x20),
                       SUB84(in_stack_fffffffffffffd38._M_node,0),in_stack_fffffffffffffd34,
                       in_stack_fffffffffffffd30);
      local_1c9 = 0;
      std::shared_ptr<indigox::Element>::shared_ptr<indigox::Element,void>
                ((shared_ptr<indigox::Element> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00),
                 (Element *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      std::__cxx11::string::~string(local_1c8);
      std::__cxx11::string::~string(local_1a8);
      in_stack_fffffffffffffd58 = in_RDI;
      this_00 = std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                ::operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              *)0x124512);
      in_stack_fffffffffffffd66 = Element::GetAtomicNumber(this_00);
      local_1ca = in_stack_fffffffffffffd66;
      pVar5 = std::
              map<unsigned_char,std::shared_ptr<indigox::Element>,std::less<unsigned_char>,std::allocator<std::pair<unsigned_char_const,std::shared_ptr<indigox::Element>>>>
              ::emplace<unsigned_char,std::shared_ptr<indigox::Element>&>
                        (in_stack_fffffffffffffd10,
                         (uchar *)CONCAT44(in_stack_fffffffffffffd0c,uVar4),
                         (shared_ptr<indigox::Element> *)
                         CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      in_stack_fffffffffffffd50 = pVar5.first._M_node;
      in_stack_fffffffffffffd4f = pVar5.second;
      in_stack_fffffffffffffd40 = in_RDI + 0x30;
      local_1e0 = in_stack_fffffffffffffd50._M_node;
      local_1d8 = in_stack_fffffffffffffd4f;
      std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x124586);
      Element::GetSymbol_abi_cxx11_
                ((Element *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      pVar6 = std::
              map<std::__cxx11::string,std::weak_ptr<indigox::Element>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
              ::emplace<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                        ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
                          *)in_stack_fffffffffffffd10,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT44(in_stack_fffffffffffffd0c,uVar4),
                         (shared_ptr<indigox::Element> *)
                         CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      in_stack_fffffffffffffd38 = pVar6.first._M_node;
      local_208 = pVar6.second;
      in_stack_fffffffffffffd34 = (float)CONCAT13(local_208,SUB43(in_stack_fffffffffffffd34,0));
      local_210 = in_stack_fffffffffffffd38._M_node;
      std::__cxx11::string::~string(local_200);
      std::__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<indigox::Element,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x124600);
      Element::GetName_abi_cxx11_
                ((Element *)CONCAT44(in_stack_fffffffffffffcfc,in_stack_fffffffffffffcf8));
      std::
      map<std::__cxx11::string,std::weak_ptr<indigox::Element>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::weak_ptr<indigox::Element>>>>
      ::emplace<std::__cxx11::string,std::shared_ptr<indigox::Element>&>
                ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::weak_ptr<indigox::Element>_>_>_>
                  *)in_stack_fffffffffffffd10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffd0c,uVar4),
                 (shared_ptr<indigox::Element> *)
                 CONCAT44(in_stack_fffffffffffffd04,in_stack_fffffffffffffd00));
      std::__cxx11::string::~string(local_230);
      local_118 = 0;
      std::shared_ptr<indigox::Element>::~shared_ptr((shared_ptr<indigox::Element> *)0x124674);
    }
    else {
      local_118 = local_118 + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&local_128);
  }
  std::__cxx11::string::~string(local_f8);
  std::__cxx11::string::~string(local_d0);
  utils::FileReader::~FileReader((FileReader *)0x1247a8);
  std::__cxx11::string::~string(local_70);
  std::__cxx11::string::~string(local_50);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)in_stack_fffffffffffffd10);
  return;
}

Assistant:

void PeriodicTable::GeneratePeriodicTable() {
    /// @todo Check for duplicate elements and skip them.
    /// @todo Ensure all columns are populated.
    std::vector<String> lines;
    if (Options::DATA_DIRECTORY.back() != '/') {
      Options::DATA_DIRECTORY.append("/");
    }
    String path = Options::DATA_DIRECTORY;
    String file = Options::PERIODIC_TABLE_FILE;
    //if (path.back() != '/') path.append("/");
    utils::FileReader fr(path + file);
    fr.GetAllItems(lines);
    
    String n = "", s = "";
    uint8_t g = 0, p = 0, z = 0, v = 0, o = 0, h = 0;
    Float m = 0.0f, r = 0.0f, c = 0.0f, V = 0.0f, e = 0.0f;
    int count = 0;
    
    for (String& line : lines) {
      switch (count) {
        case 0: z = std::stoi(line); break;
        case 1: n = utils::toUpperFirst(&line); break;
        case 2: s = utils::toUpperFirst(&line); break;
        case 3: m = std::stof(line); break;
        case 4: g = std::stoi(line); break;
        case 5: p = std::stoi(line); break;
        case 6: v = std::stoi(line); break;
        case 7: o = std::stoi(line); break;
        case 8: h = std::stoi(line); break;
        case 9: r = std::stof(line); break;
        case 10: c = std::stof(line); break;
        case 11: V = std::stof(line); break;
        case 12: e = std::stof(line); break;
        default:
          break;
      }
      
      if (count == 12) {
        Element_p elem = Element_p(new Element(z, n, s, m, g, p, v, o, h, r, c,
                                               V, e));
        z_to_.emplace(elem->GetAtomicNumber(), elem);
        name_to_.emplace(elem->GetSymbol(), elem);
        name_to_.emplace(elem->GetName(), elem);
        count = 0;
      } else count++;
    }
  }